

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

int stumpless_trace_log(stumpless_target *target,int priority,char *file,int line,char *func,
                       char *message,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [48];
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined1 local_58 [8];
  va_list subs;
  int result;
  char *message_local;
  char *func_local;
  int line_local;
  char *file_local;
  int priority_local;
  stumpless_target *target_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  subs[0].overflow_arg_area = local_108;
  subs[0]._0_8_ = &stack0x00000008;
  local_58._4_4_ = 0x30;
  local_58._0_4_ = 0x30;
  iVar1 = vstumpless_trace_log(target,priority,file,line,func,message,(__va_list_tag *)local_58);
  return iVar1;
}

Assistant:

int
stumpless_trace_log( struct stumpless_target *target,
                     int priority,
                     const char *file,
                     int line,
                     const char *func,
                     const char *message,
                     ... ) {
  int result;
  va_list subs;

  va_start( subs, message );
  result = vstumpless_trace_log( target,
                                 priority,
                                 file,
                                 line,
                                 func,
                                 message,
                                 subs );
  va_end( subs );

  return result;
}